

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O3

AssertionExpr *
slang::ast::DisableIffAssertionExpr::fromSyntax
          (DisableIffSyntax *syntax,AssertionExpr *expr,ASTContext *context)

{
  Scope *pSVar1;
  ExpressionSyntax *syntax_00;
  Compilation *this;
  Expression *this_00;
  DisableIffAssertionExpr *pDVar2;
  char *func;
  SourceRange sourceRange;
  SampledValueExprVisitor local_40;
  
  pSVar1 = (context->scope).ptr;
  if (pSVar1 == (Scope *)0x0) {
    func = 
    "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]";
  }
  else {
    syntax_00 = (syntax->expr).ptr;
    if (syntax_00 != (ExpressionSyntax *)0x0) {
      this = pSVar1->compilation;
      this_00 = bindExpr(syntax_00,context,false);
      local_40.isFutureGlobal = false;
      local_40.localVarCode.subsystem = Statements;
      local_40.localVarCode.code = 0x11;
      local_40.matchedCode.subsystem = Statements;
      local_40.matchedCode.code = 0x12;
      local_40.context = context;
      Expression::visitExpression<slang::ast::Expression_const,slang::ast::SampledValueExprVisitor&>
                (this_00,this_00,&local_40);
      if ((context->assertionInstance != (AssertionInstanceDetails *)0x0) &&
         (context->assertionInstance->isRecursive == true)) {
        sourceRange = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
        ASTContext::addDiag(context,(DiagCode)0x380008,sourceRange);
      }
      pDVar2 = BumpAllocator::
               emplace<slang::ast::DisableIffAssertionExpr,slang::ast::Expression_const&,slang::ast::AssertionExpr_const&>
                         (&this->super_BumpAllocator,this_00,expr);
      return &pDVar2->super_AssertionExpr;
    }
    func = 
    "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
    ;
  }
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,func);
}

Assistant:

bool visitInvalid(const AssertionExpr&) { return false; }